

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O3

void safe_strcpy(char *dst,size_t dstlen,char *src)

{
  bool bVar1;
  size_t sVar2;
  ulong __n;
  
  bVar1 = dstlen == 0 || dst == (char *)0x0;
  if (src == (char *)0x0) {
    if (bVar1) {
      return;
    }
  }
  else {
    if (bVar1 || dst == src) {
      return;
    }
    sVar2 = strlen(src);
    __n = dstlen - 1;
    if (sVar2 <= dstlen - 1) {
      __n = sVar2;
    }
    memcpy(dst,src,__n);
    dst = dst + __n;
  }
  *dst = '\0';
  return;
}

Assistant:

void safe_strcpy(char *dst, size_t dstlen, const char *src)
{
    safe_strcpyl(dst, dstlen, src, src != 0 ? strlen(src) : 0);
}